

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::SrcDir_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  string *in_RDI;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  char in_R9B;
  initializer_list<const_char_*> environment_variables;
  FilePath argv_0;
  FilePath local_80;
  undefined1 local_60 [32];
  char *local_40;
  long *local_38 [2];
  long local_28 [2];
  
  local_40 = "TEST_SRCDIR";
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&internal::g_argvs_abi_cxx11_);
  paVar1 = &local_80.pathname_.field_2;
  local_80.pathname_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,*(long *)local_60._0_8_,
             *(size_type *)(local_60._0_8_ + 8) + *(long *)local_60._0_8_);
  _Var2._M_p = local_80.pathname_._M_dataplus._M_p;
  _Var3._M_p = local_80.pathname_._M_dataplus._M_p;
  if (local_80.pathname_._M_string_length != 0) {
    do {
      in_R8B = *_Var3._M_p != '/';
      in_R9B = _Var2._M_p == local_80.pathname_._M_dataplus._M_p || (bool)in_R8B;
      if (((bool)in_R9B) || (_Var2._M_p[-1] != '/')) {
        *_Var2._M_p = *_Var3._M_p;
        _Var2._M_p = _Var2._M_p + 1;
      }
      _Var3._M_p = _Var3._M_p + 1;
    } while (_Var3._M_p != local_80.pathname_._M_dataplus._M_p + local_80.pathname_._M_string_length
            );
  }
  local_80.pathname_._M_string_length = (long)_Var2._M_p - (long)local_80.pathname_._M_dataplus._M_p
  ;
  *_Var2._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  internal::FilePath::RemoveFileName((FilePath *)local_60,&local_80);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,local_60._0_8_,
             (pointer)(local_60._0_8_ + (long)(_Alloc_hider *)local_60._8_8_));
  if ((pointer)local_60._0_8_ != (pointer)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.pathname_._M_dataplus._M_p,
                    local_80.pathname_.field_2._M_allocated_capacity + 1);
  }
  environment_variables._M_len = (size_type)local_38[0];
  environment_variables._M_array = (iterator)0x1;
  GetDirFromEnv_abi_cxx11_
            (in_RDI,(testing *)&local_40,environment_variables,
             (char *)CONCAT71(in_register_00000081,in_R8B),in_R9B);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string SrcDir() {
#if defined(GTEST_CUSTOM_SRCDIR_FUNCTION_)
  return GTEST_CUSTOM_SRCDIR_FUNCTION_();
#elif GTEST_OS_WINDOWS || GTEST_OS_WINDOWS_MOBILE
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '\\');
#elif GTEST_OS_LINUX_ANDROID
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#else
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#endif
}